

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O0

void keyboardCallback(GLFWwindow *param_1,int key,int param_3,int action,int param_5)

{
  ImGuiIO *pIVar1;
  ImGuiIO *io;
  int param_4_local;
  int action_local;
  int param_2_local;
  int key_local;
  GLFWwindow *param_0_local;
  
  pIVar1 = ImGui::GetIO();
  if (((pIVar1->WantCaptureKeyboard & 1U) == 0) && (action == 1)) {
    if (key == 0x43) {
      if (g_app.recorder.on != 0) {
        g_app.recorder.frame = 0;
        g_app.recorder.capture = g_app.recorder.capture + 1;
      }
      g_app.recorder.on = (int)((g_app.recorder.on != 0 ^ 0xffU) & 1);
    }
    else if (key == 0x52) {
      loadBuffers();
      loadPrograms();
    }
    else if (key == 0x100) {
      g_app.viewer.hud = (bool)((g_app.viewer.hud ^ 0xffU) & 1);
    }
  }
  return;
}

Assistant:

void
keyboardCallback(
    GLFWwindow*,
    int key, int, int action, int
) {
    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureKeyboard)
        return;

    if (action == GLFW_PRESS) {
        switch (key) {
        case GLFW_KEY_ESCAPE:
            g_app.viewer.hud = !g_app.viewer.hud;
            break;
        case GLFW_KEY_C:
            if (g_app.recorder.on) {
                g_app.recorder.frame = 0;
                ++g_app.recorder.capture;
            }
            g_app.recorder.on = !g_app.recorder.on;
            break;
        case GLFW_KEY_R:
            loadBuffers();
            loadPrograms();
            break;
        default: break;
        }
    }
}